

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::ShaderRenderCase::iterate(ShaderRenderCase *this)

{
  size_t *this_00;
  int height_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  int gridSize;
  undefined4 extraout_var;
  int *piVar3;
  char *local_208;
  undefined1 local_1c0 [7];
  bool testOk;
  Surface refImage;
  undefined1 local_198 [8];
  Surface resImage;
  undefined1 local_170 [8];
  QuadGrid quadGrid;
  int height;
  int width;
  IVec2 viewportSize;
  deUint32 programID;
  Functions *gl;
  ShaderRenderCase *this_local;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar2);
  err = (**(code **)(register0x00000000 + 0x800))();
  glu::checkError(err,"ShaderRenderCase::iterate() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x1d8);
  viewportSize.m_data[0] = glu::ShaderProgram::getProgram(this->m_program);
  (**(code **)(stack0xffffffffffffffe8 + 0x1680))(viewportSize.m_data[0]);
  getViewportSize((ShaderRenderCase *)&height);
  piVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&height);
  iVar2 = *piVar3;
  piVar3 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&height);
  height_00 = *piVar3;
  gridSize = 4;
  if ((this->m_isVertexCase & 1U) != 0) {
    gridSize = 0x40;
  }
  this_00 = &resImage.m_pixels.m_cap;
  quadGrid.m_indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = height_00;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this_00,0.0,0.0,0.0,1.0);
  QuadGrid::QuadGrid((QuadGrid *)local_170,gridSize,iVar2,height_00,(Vec4 *)this_00,
                     &this->m_userAttribTransforms,&this->m_textures);
  tcu::Surface::Surface
            ((Surface *)local_198,iVar2,
             quadGrid.m_indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  render(this,(Surface *)local_198,viewportSize.m_data[0],(QuadGrid *)local_170);
  tcu::Surface::Surface
            ((Surface *)local_1c0,iVar2,
             quadGrid.m_indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  if ((this->m_isVertexCase & 1U) == 0) {
    computeFragmentReference(this,(Surface *)local_1c0,(QuadGrid *)local_170);
  }
  else {
    computeVertexReference(this,(Surface *)local_1c0,(QuadGrid *)local_170);
  }
  bVar1 = compareImages(this,(Surface *)local_198,(Surface *)local_1c0,0.05);
  (**(code **)(stack0xffffffffffffffe8 + 0x1680))(0);
  if (bVar1) {
    local_208 = "Pass";
  }
  else {
    local_208 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,local_208);
  tcu::Surface::~Surface((Surface *)local_1c0);
  tcu::Surface::~Surface((Surface *)local_198);
  QuadGrid::~QuadGrid((QuadGrid *)local_170);
  return STOP;
}

Assistant:

TestNode::IterateResult ShaderRenderCase::iterate(void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::iterate() begin");

	DE_ASSERT(m_program);
	deUint32 programID = m_program->getProgram();
	gl.useProgram(programID);

	// Create quad grid.
	IVec2 viewportSize = getViewportSize();
	int   width		   = viewportSize.x();
	int   height	   = viewportSize.y();

	// \todo [petri] Better handling of constCoords (render in multiple chunks, vary coords).
	QuadGrid quadGrid(m_isVertexCase ? GRID_SIZE : 4, width, height, Vec4(0.0f, 0.0f, 0.0f, 1.0f),
					  m_userAttribTransforms, m_textures);

	// Render result.
	Surface resImage(width, height);
	render(resImage, programID, quadGrid);

	// Compute reference.
	Surface refImage(width, height);
	if (m_isVertexCase)
		computeVertexReference(refImage, quadGrid);
	else
		computeFragmentReference(refImage, quadGrid);

	// Compare.
	bool testOk = compareImages(resImage, refImage, 0.05f);

	// De-initialize.
	gl.useProgram(0);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, testOk ? "Pass" : "Fail");
	return TestNode::STOP;
}